

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O1

void helics::addFields(string_view key,string_view typeName,InterfaceHandle hid,MapType *searchMap,
                      AliasT *aliases)

{
  basic_string_view<char,_std::char_traits<char>_> *pbVar1;
  iterator iVar2;
  runtime_error *prVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  char *pcVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  basic_string_view<char,_std::char_traits<char>_> *__k;
  pair<std::__detail::_Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_false,_true>,_bool>
  pVar7;
  InterfaceHandle local_124;
  size_type *local_120;
  size_type local_118;
  size_type local_110;
  undefined8 uStack_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  pcVar5 = typeName._M_str;
  local_40._M_str = key._M_str;
  local_40._M_len = key._M_len;
  local_124.hid = hid.hid;
  pVar7 = std::__detail::
          _Insert_base<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::InterfaceHandle>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::InterfaceHandle>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          try_emplace<std::basic_string_view<char,std::char_traits<char>>const&,helics::InterfaceHandle&>
                    ((_Insert_base<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::InterfaceHandle>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::InterfaceHandle>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)searchMap,(const_iterator)0x0,&local_40,&local_124);
  if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"duplicate ","");
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,pcVar5,pcVar5 + typeName._M_len);
    std::operator+(&local_c0,&local_100,&local_e0);
    pbVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             append(&local_c0," key found");
    local_120 = (size_type *)(pbVar4->_M_dataplus)._M_p;
    paVar6 = &pbVar4->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120 == paVar6) {
      local_110 = paVar6->_M_allocated_capacity;
      uStack_108 = *(undefined8 *)((long)&pbVar4->field_2 + 8);
      local_120 = &local_110;
    }
    else {
      local_110 = paVar6->_M_allocated_capacity;
    }
    local_118 = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    std::runtime_error::runtime_error(prVar3,(string *)&local_120);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = std::
          _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&aliases->_M_h,&local_40);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    __k = *(basic_string_view<char,_std::char_traits<char>_> **)
           ((long)iVar2.
                  super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_true>
                  ._M_cur + 0x18);
    pbVar1 = *(basic_string_view<char,_std::char_traits<char>_> **)
              ((long)iVar2.
                     super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_true>
                     ._M_cur + 0x20);
    if (__k != pbVar1) {
      do {
        pVar7 = std::__detail::
                _Insert_base<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::InterfaceHandle>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::InterfaceHandle>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                ::
                try_emplace<std::basic_string_view<char,std::char_traits<char>>const&,helics::InterfaceHandle&>
                          ((_Insert_base<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::InterfaceHandle>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::InterfaceHandle>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                            *)searchMap,(const_iterator)0x0,__k,&local_124);
        if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"duplicate ","");
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_80,pcVar5,pcVar5 + typeName._M_len);
          std::operator+(&local_e0,&local_60,&local_80);
          pbVar4 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                             (&local_e0," alias key(");
          local_100._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
          paVar6 = &pbVar4->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p == paVar6) {
            local_100.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
            local_100.field_2._8_4_ = *(undefined4 *)((long)&pbVar4->field_2 + 8);
            local_100.field_2._12_4_ = *(undefined4 *)((long)&pbVar4->field_2 + 0xc);
            local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
          }
          else {
            local_100.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
          }
          local_100._M_string_length = pbVar4->_M_string_length;
          (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
          pbVar4->_M_string_length = 0;
          (pbVar4->field_2)._M_local_buf[0] = '\0';
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a0,__k->_M_str,__k->_M_str + __k->_M_len);
          std::operator+(&local_c0,&local_100,&local_a0);
          pbVar4 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                             (&local_c0,") found");
          local_120 = (size_type *)(pbVar4->_M_dataplus)._M_p;
          paVar6 = &pbVar4->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120 == paVar6) {
            local_110 = paVar6->_M_allocated_capacity;
            uStack_108 = *(undefined8 *)((long)&pbVar4->field_2 + 8);
            local_120 = &local_110;
          }
          else {
            local_110 = paVar6->_M_allocated_capacity;
          }
          local_118 = pbVar4->_M_string_length;
          (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
          pbVar4->_M_string_length = 0;
          (pbVar4->field_2)._M_local_buf[0] = '\0';
          std::runtime_error::runtime_error(prVar3,(string *)&local_120);
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        __k = __k + 1;
      } while (__k != pbVar1);
    }
  }
  return;
}

Assistant:

static void addFields(std::string_view key,
                      std::string_view typeName,
                      InterfaceHandle hid,
                      MapType& searchMap,
                      AliasT aliases)
{
    auto placed = searchMap.try_emplace(key, hid);
    if (!placed.second) {
        throw std::runtime_error(std::string("duplicate ") + std::string(typeName) + " key found");
    }
    auto aliasRange = aliases.find(key);
    if (aliasRange != aliases.end()) {
        for (auto& alias : aliasRange->second) {
            placed = searchMap.try_emplace(alias, hid);
            if (!placed.second) {
                throw std::runtime_error(std::string("duplicate ") + std::string(typeName) +
                                         " alias key(" + std::string(alias) + ") found");
            }
        }
    }
}